

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O2

SVGLinearGradientAttributes * __thiscall
lunasvg::SVGLinearGradientElement::collectGradientAttributes
          (SVGLinearGradientAttributes *__return_storage_ptr__,SVGLinearGradientElement *this)

{
  ElementID EVar1;
  bool bVar2;
  SVGGradientElement *pSVar3;
  size_type sVar4;
  SVGLinearGradientElement *element;
  SVGGradientElement *current;
  set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  processedGradients;
  
  __return_storage_ptr__->m_x2 = (SVGLinearGradientElement *)0x0;
  __return_storage_ptr__->m_y2 = (SVGLinearGradientElement *)0x0;
  __return_storage_ptr__->m_x1 = (SVGLinearGradientElement *)0x0;
  __return_storage_ptr__->m_y1 = (SVGLinearGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientUnits = (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientContentElement =
       (SVGGradientElement *)0x0;
  processedGradients._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &processedGradients._M_t._M_impl.super__Rb_tree_header._M_header;
  processedGradients._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  processedGradients._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  processedGradients._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientTransform =
       (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_spreadMethod = (SVGGradientElement *)0x0;
  current = &this->super_SVGGradientElement;
  processedGradients._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       processedGradients._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    SVGGradientElement::collectGradientAttributes
              (current,&__return_storage_ptr__->super_SVGGradientAttributes);
    pSVar3 = current;
    if ((current->super_SVGPaintElement).super_SVGElement.m_id == LinearGradient) {
      if (__return_storage_ptr__->m_x1 == (SVGLinearGradientElement *)0x0) {
        bVar2 = SVGElement::hasAttribute((SVGElement *)current,X1);
        if (bVar2) {
          __return_storage_ptr__->m_x1 = (SVGLinearGradientElement *)pSVar3;
        }
      }
      if (__return_storage_ptr__->m_y1 == (SVGLinearGradientElement *)0x0) {
        bVar2 = SVGElement::hasAttribute((SVGElement *)pSVar3,Y1);
        if (bVar2) {
          __return_storage_ptr__->m_y1 = (SVGLinearGradientElement *)pSVar3;
        }
      }
      if (__return_storage_ptr__->m_x2 == (SVGLinearGradientElement *)0x0) {
        bVar2 = SVGElement::hasAttribute((SVGElement *)pSVar3,X2);
        if (bVar2) {
          __return_storage_ptr__->m_x2 = (SVGLinearGradientElement *)pSVar3;
        }
      }
      if (__return_storage_ptr__->m_y2 == (SVGLinearGradientElement *)0x0) {
        bVar2 = SVGElement::hasAttribute((SVGElement *)pSVar3,Y2);
        if (bVar2) {
          __return_storage_ptr__->m_y2 = (SVGLinearGradientElement *)pSVar3;
        }
      }
    }
    pSVar3 = (SVGGradientElement *)
             SVGURIReference::getTargetElement
                       (&current->super_SVGURIReference,
                        (this->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.
                        super_SVGNode.m_document);
    if ((pSVar3 == (SVGGradientElement *)0x0) ||
       ((EVar1 = (pSVar3->super_SVGPaintElement).super_SVGElement.m_id, EVar1 != LinearGradient &&
        (EVar1 != RadialGradient)))) break;
    std::
    _Rb_tree<lunasvg::SVGGradientElement_const*,lunasvg::SVGGradientElement_const*,std::_Identity<lunasvg::SVGGradientElement_const*>,std::less<lunasvg::SVGGradientElement_const*>,std::allocator<lunasvg::SVGGradientElement_const*>>
    ::_M_insert_unique<lunasvg::SVGGradientElement_const*const&>
              ((_Rb_tree<lunasvg::SVGGradientElement_const*,lunasvg::SVGGradientElement_const*,std::_Identity<lunasvg::SVGGradientElement_const*>,std::less<lunasvg::SVGGradientElement_const*>,std::allocator<lunasvg::SVGGradientElement_const*>>
                *)&processedGradients,&current);
    current = pSVar3;
    sVar4 = std::
            set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
            ::count(&processedGradients,&current);
  } while (sVar4 == 0);
  SVGLinearGradientAttributes::setDefaultValues(__return_storage_ptr__,this);
  std::
  _Rb_tree<const_lunasvg::SVGGradientElement_*,_const_lunasvg::SVGGradientElement_*,_std::_Identity<const_lunasvg::SVGGradientElement_*>,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  ::~_Rb_tree(&processedGradients._M_t);
  return __return_storage_ptr__;
}

Assistant:

SVGLinearGradientAttributes SVGLinearGradientElement::collectGradientAttributes() const
{
    SVGLinearGradientAttributes attributes;
    std::set<const SVGGradientElement*> processedGradients;
    const SVGGradientElement* current = this;
    while(true) {
        current->collectGradientAttributes(attributes);
        if(current->id() == ElementID::LinearGradient) {
            auto element = static_cast<const SVGLinearGradientElement*>(current);
            if(!attributes.hasX1() && element->hasAttribute(PropertyID::X1))
                attributes.setX1(element);
            if(!attributes.hasY1() && element->hasAttribute(PropertyID::Y1))
                attributes.setY1(element);
            if(!attributes.hasX2() && element->hasAttribute(PropertyID::X2))
                attributes.setX2(element);
            if(!attributes.hasY2() && element->hasAttribute(PropertyID::Y2)) {
                attributes.setY2(element);
            }
        }

        auto targetElement = current->getTargetElement(document());
        if(!targetElement || !(targetElement->id() == ElementID::LinearGradient || targetElement->id() == ElementID::RadialGradient))
            break;
        processedGradients.insert(current);
        current = static_cast<const SVGGradientElement*>(targetElement);
        if(processedGradients.count(current) > 0) {
            break;
        }
    }

    attributes.setDefaultValues(this);
    return attributes;
}